

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_BrDeleteExplicitSelectedFails_Test::
InterpreterTestSuite_PC_BrDeleteExplicitSelectedFails_Test
          (InterpreterTestSuite_PC_BrDeleteExplicitSelectedFails_Test *this)

{
  InterpreterTestSuite_PC_BrDeleteExplicitSelectedFails_Test *this_local;
  
  InterpreterTestSuite::InterpreterTestSuite(&this->super_InterpreterTestSuite);
  (this->super_InterpreterTestSuite).super_Test._vptr_Test =
       (_func_int **)&PTR__InterpreterTestSuite_PC_BrDeleteExplicitSelectedFails_Test_005b5c58;
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BrDeleteExplicitSelectedFails)
{
    TestContext ctx;
    InitContext(ctx);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x3F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0,
                                             "", 0, 0x3F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);

    EXPECT_EQ(ctx.mRegistry->SetCurrentNetwork(2), RegistryStatus::kSuccess);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("br delete 1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());

    BorderRouterArray bra;
    EXPECT_EQ(ctx.mRegistry->GetAllBorderRouters(bra), RegistryStatus::kSuccess);
    EXPECT_EQ(bra.size(), 2);
}